

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_test_connection.c
# Opt level: O0

apx_error_t
apx_serverTestConnection_write_remote_data
          (apx_serverTestConnection_t *self,uint32_t address,uint8_t *payload_data,
          apx_size_t payload_size)

{
  apx_size_t aVar1;
  apx_fileManager_t *self_00;
  uint8_t *msg_data;
  uint8_t *msg;
  apx_error_t retval;
  apx_size_t header_size;
  apx_fileManager_t *file_manager;
  uint8_t header [4];
  apx_size_t payload_size_local;
  uint8_t *payload_data_local;
  uint32_t address_local;
  apx_serverTestConnection_t *self_local;
  
  if ((self == (apx_serverTestConnection_t *)0x0) || (payload_size == 0)) {
    self_local._4_4_ = 1;
  }
  else {
    file_manager._4_4_ = payload_size;
    _header = payload_data;
    self_00 = apx_serverConnection_get_file_manager(&self->base);
    if (self_00 == (apx_fileManager_t *)0x0) {
      __assert_fail("file_manager != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/server_test_connection.c"
                    ,0x159,
                    "apx_error_t apx_serverTestConnection_write_remote_data(apx_serverTestConnection_t *, uint32_t, const uint8_t *, apx_size_t)"
                   );
    }
    aVar1 = rmf_address_encode((uint8_t *)&file_manager,4,address,false);
    if (aVar1 == 0) {
      self_local._4_4_ = 6;
    }
    else {
      msg._0_4_ = 2;
      msg_data = (uint8_t *)malloc((ulong)aVar1 + (ulong)file_manager._4_4_);
      if (msg_data != (uint8_t *)0x0) {
        memcpy(msg_data,&file_manager,(ulong)aVar1);
        memcpy(msg_data + aVar1,_header,(ulong)file_manager._4_4_);
        msg._0_4_ = apx_fileManager_message_received(self_00,msg_data,aVar1 + file_manager._4_4_);
        free(msg_data);
      }
      self_local._4_4_ = (apx_error_t)msg;
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_serverTestConnection_write_remote_data(apx_serverTestConnection_t* self, uint32_t address, uint8_t const* payload_data, apx_size_t payload_size)
{
   if ((self != NULL) && (payload_size > 0))
   {
      uint8_t header[RMF_HIGH_ADDR_SIZE];
      apx_fileManager_t* file_manager = apx_serverConnection_get_file_manager(&self->base);
      assert(file_manager != NULL);
      apx_size_t header_size = (apx_size_t)rmf_address_encode(header, sizeof(header), address, false);
      if (header_size == 0u)
      {
         return APX_INTERNAL_ERROR;
      }
      apx_error_t retval = APX_MEM_ERROR;
      uint8_t* msg = (uint8_t*)malloc(((size_t)header_size) + payload_size);
      if (msg != NULL)
      {
         memcpy(msg, &header[0], header_size);
         memcpy(msg + header_size, payload_data, payload_size);
         retval = apx_fileManager_message_received(file_manager, msg, header_size + payload_size);
         free(msg);
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}